

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::Stats::FinishedSingleOp(Stats *this)

{
  undefined8 uVar1;
  int iVar2;
  double value;
  undefined1 auVar3 [16];
  double dVar4;
  
  if (FLAGS_histogram) {
    uVar1 = (**(code **)(*(anonymous_namespace)::g_env + 0x98))();
    auVar3._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._12_4_ = 0x45300000;
    dVar4 = (auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    value = dVar4 - this->last_op_finish_;
    Histogram::Add(&this->hist_,value);
    if (20000.0 < value) {
      _GLOBAL__N_1::Stats::FinishedSingleOp();
    }
    this->last_op_finish_ = dVar4;
  }
  iVar2 = this->done_ + 1;
  this->done_ = iVar2;
  if (this->next_report_ <= iVar2) {
    _GLOBAL__N_1::Stats::FinishedSingleOp();
  }
  return;
}

Assistant:

void FinishedSingleOp() {
    if (FLAGS_histogram) {
      double now = g_env->NowMicros();
      double micros = now - last_op_finish_;
      hist_.Add(micros);
      if (micros > 20000) {
        fprintf(stderr, "long op: %.1f micros%30s\r", micros, "");
        fflush(stderr);
      }
      last_op_finish_ = now;
    }

    done_++;
    if (done_ >= next_report_) {
      if (next_report_ < 1000)
        next_report_ += 100;
      else if (next_report_ < 5000)
        next_report_ += 500;
      else if (next_report_ < 10000)
        next_report_ += 1000;
      else if (next_report_ < 50000)
        next_report_ += 5000;
      else if (next_report_ < 100000)
        next_report_ += 10000;
      else if (next_report_ < 500000)
        next_report_ += 50000;
      else
        next_report_ += 100000;
      fprintf(stderr, "... finished %d ops%30s\r", done_, "");
      fflush(stderr);
    }
  }